

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

Vector3D * __thiscall CMU462::Face::normal(Vector3D *__return_storage_ptr__,Face *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  Vector3D local_28;
  
  p_Var2 = (this->_halfedge)._M_node;
  p_Var8 = p_Var2[2]._M_prev;
  local_28.x = 0.0;
  local_28.y = 0.0;
  local_28.z = 0.0;
  p_Var5 = p_Var2;
  p_Var6 = p_Var8[1]._M_prev;
  p_Var7 = p_Var8[2]._M_next;
  p_Var8 = p_Var8[2]._M_prev;
  do {
    p_Var5 = p_Var5[2]._M_next;
    p_Var3 = p_Var5[2]._M_prev;
    p_Var1 = p_Var3[1]._M_prev;
    p_Var4 = p_Var3[2]._M_next;
    p_Var3 = p_Var3[2]._M_prev;
    local_28.x = local_28.x + ((double)p_Var3 * (double)p_Var7 - (double)p_Var8 * (double)p_Var4);
    local_28.y = local_28.y + ((double)p_Var1 * (double)p_Var8 - (double)p_Var6 * (double)p_Var3);
    local_28.z = local_28.z + ((double)p_Var6 * (double)p_Var4 - (double)p_Var7 * (double)p_Var1);
    p_Var6 = p_Var1;
    p_Var7 = p_Var4;
    p_Var8 = p_Var3;
  } while (p_Var5 != p_Var2);
  Vector3D::unit(&local_28);
  return __return_storage_ptr__;
}

Assistant:

Vector3D Face::normal() const {
    Vector3D N(0., 0., 0.);

    HalfedgeCIter h = halfedge();
    do {
      Vector3D pi = h->vertex()->position;
      Vector3D pj = h->next()->vertex()->position;

      N += cross(pi, pj);

      h = h->next();
    } while (h != halfedge());

    return N.unit();
  }